

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O3

long testIntegerToString(int count)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  long lVar4;
  timeval tv;
  string local_58;
  timeval local_38;
  
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  _Var2 = local_38.tv_usec;
  _Var1 = local_38.tv_sec;
  if (0 < count) {
    uVar3 = extraout_RDX;
    do {
      FIX::IntConvertor::convert_abi_cxx11_(&local_58,(IntConvertor *)0x4d2,(signed_int)uVar3);
      uVar3 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        uVar3 = extraout_RDX_01;
      }
      count = count + -1;
    } while (count != 0);
  }
  lVar4 = SUB168(SEXT816(_Var2) * SEXT816(-0x20c49ba5e353f7cf),8);
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  return (local_38.tv_sec - _Var1) * 1000 +
         local_38.tv_usec / 1000 + ((lVar4 >> 7) - (lVar4 >> 0x3f));
}

Assistant:

long testIntegerToString( int count )
{
  count = count - 1;

  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    FIX::IntConvertor::convert( 1234 );
  }
  return GetTickCount() - start;
}